

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

ssize_t buffer_find(Buffer *buffer,size_t start,void *_data,size_t len)

{
  byte bVar1;
  uint8 *puVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  uint8 *__s1;
  BufferBlock *pBVar6;
  BufferBlock *pBVar7;
  ulong uVar8;
  uint8 *__s;
  ulong uVar9;
  ssize_t unaff_R12;
  long lVar10;
  ulong __n;
  void *__s2;
  
  if (len == 0) {
    unaff_R12 = 0;
  }
  else if (buffer->total_bytes - start < len || buffer->total_bytes <= start) {
LAB_0011d3e5:
    unaff_R12 = -1;
  }
  else {
    pBVar6 = buffer->head;
    if (start == 0) {
      __s = pBVar6->data;
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      while( true ) {
        if (pBVar6 == (BufferBlock *)0x0) {
          __assert_fail("item != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                        ,0x3d4,
                        "ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)");
        }
        uVar5 = pBVar6->bytes + uVar9;
        if (start < uVar5) break;
        pBVar6 = pBVar6->next;
        uVar9 = uVar5;
      }
      __s = pBVar6->data + (start - uVar9);
    }
    if (__s == (uint8 *)0x0) {
      __assert_fail("ptr != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                    ,0x3e2,"ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)"
                   );
    }
    bVar1 = *_data;
    do {
      if (pBVar6 == (BufferBlock *)0x0) goto LAB_0011d3e5;
      puVar2 = pBVar6->data;
      sVar3 = pBVar6->bytes;
      for (__s1 = (uint8 *)memchr(__s,(uint)bVar1,(size_t)(puVar2 + (sVar3 - (long)__s)));
          __s1 != (uint8 *)0x0; __s1 = (uint8 *)memchr(__s1 + 1,(uint)bVar1,(sVar3 - lVar10) - 1)) {
        lVar10 = (long)__s1 - (long)puVar2;
        if (len == 1) {
LAB_0011d598:
          return lVar10 + uVar9;
        }
        uVar5 = sVar3 - lVar10;
        if (len <= sVar3 - lVar10) {
          uVar5 = len;
        }
        if ((sVar3 - lVar10 == 0) || (iVar4 = bcmp(__s1,_data,uVar5), iVar4 == 0)) {
          uVar8 = len - uVar5;
          if (uVar8 == 0) goto LAB_0011d598;
          __s2 = (void *)(uVar5 + (long)_data);
          pBVar7 = pBVar6;
          while (pBVar7 = pBVar7->next, pBVar7 != (BufferBlock *)0x0) {
            uVar5 = pBVar7->bytes;
            __n = uVar5;
            if (uVar8 < uVar5) {
              __n = uVar8;
            }
            iVar4 = bcmp(pBVar7->data,__s2,__n);
            if (iVar4 != 0) break;
            if (uVar8 <= uVar5) {
              unaff_R12 = lVar10 + uVar9;
              __s = __s1;
              goto LAB_0011d562;
            }
            uVar8 = uVar8 - __n;
            __s2 = (void *)((long)__s2 + __n);
          }
        }
      }
      uVar9 = sVar3 + uVar9;
      pBVar6 = pBVar6->next;
      if (pBVar6 == (BufferBlock *)0x0) {
        __s = (uint8 *)0x0;
        pBVar6 = (BufferBlock *)0x0;
      }
      else {
        __s = pBVar6->data;
      }
LAB_0011d562:
    } while (__s1 == (uint8 *)0x0);
  }
  return unaff_R12;
}

Assistant:

ssize_t buffer_find(Buffer *buffer, const size_t start,
                    const void *_data, const size_t len)
{
    if (len == 0)
        return 0;  // I guess that's right.

    if (start >= buffer->total_bytes)
        return -1;  // definitely can't match.

    if (len > (buffer->total_bytes - start))
        return -1;  // definitely can't match.

    // Find the start point somewhere in the center of a buffer.
    BufferBlock *item = buffer->head;
    const uint8 *ptr = item->data;
    size_t pos = 0;
    if (start > 0)
    {
        while (1)
        {
            assert(item != NULL);
            if ((pos + item->bytes) > start)  // start is in this block.
            {
                ptr = item->data + (start - pos);
                break;
            } // if

            pos += item->bytes;
            item = item->next;
        } // while
    } // if

    // okay, we're at the origin of the search.
    assert(item != NULL);
    assert(ptr != NULL);

    const uint8 *data = (const uint8 *) _data;
    const uint8 first = *data;
    while (item != NULL)
    {
        const size_t itemremain = item->bytes - ((size_t)(ptr-item->data));
        ptr = (uint8 *) memchr(ptr, first, itemremain);
        while (ptr != NULL)
        {
            const size_t retval = pos + ((size_t) (ptr - item->data));
            if (len == 1)
                return retval;  // we're done, here it is!

            const size_t itemremain = item->bytes - ((size_t)(ptr-item->data));
            const size_t avail = len < itemremain ? len : itemremain;
            if ((avail == 0) || (memcmp(ptr, data, avail) == 0))
            {
                // okay, we've got a (sub)string match! Move to the next block.
                // check all blocks until we get a complete match or a failure.
                if (blockscmp(item->next, data+avail, len-avail))
                    return (ssize_t) retval;
            } // if

            // try again, further in this block.
            ptr = (uint8 *) memchr(ptr + 1, first, itemremain - 1);
        } // while

        pos += item->bytes;
        item = item->next;
        if (item != NULL)
            ptr = item->data;
    } // while

    return -1;  // no match found.
}